

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  char *pcVar3;
  float fVar4;
  ThreadLocal2 *this_00;
  long lVar5;
  long lVar6;
  long lVar7;
  MutexSys *pMVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  undefined1 *puVar25;
  ulong uVar26;
  float *pfVar27;
  ulong uVar28;
  long lVar29;
  vuint<4> vgeomID;
  Lock<embree::MutexSys> local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Lock<embree::MutexSys> local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
  *local_88;
  range<unsigned_long> *local_80;
  value_type local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  vuint<4> vprimID;
  
  uVar21 = range->_begin;
  puVar25 = (undefined1 *)((long)&prims[uVar21].lower.field_0 + 0xc);
  for (; uVar21 < range->_end; uVar21 = uVar21 + 1) {
    puVar25[3] = puVar25[3] & 7;
    puVar25 = puVar25 + 0x20;
  }
  uVar21 = range->_begin;
  uVar26 = (range->_end - uVar21) + 3 >> 2;
  vgeomID.field_0.v[0] = uVar26 * 0xb0;
  this_00 = (alloc.talloc1)->parent;
  local_88 = this;
  local_80 = range;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_b8.locked = true;
    local_b8.mutex = &this_00->mutex;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_e8.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_e8.locked = true;
    local_78 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,&local_78);
    Lock<embree::MutexSys>::~Lock(&local_e8);
    Lock<embree::MutexSys>::~Lock(&local_b8);
  }
  uVar18 = vgeomID.field_0.v[0];
  (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + vgeomID.field_0.v[0];
  sVar22 = (alloc.talloc1)->cur;
  uVar23 = (ulong)(-(int)sVar22 & 0xf);
  uVar19 = sVar22 + vgeomID.field_0.v[0] + uVar23;
  (alloc.talloc1)->cur = uVar19;
  if ((alloc.talloc1)->end < uVar19) {
    (alloc.talloc1)->cur = sVar22;
    pMVar8 = (MutexSys *)(alloc.talloc1)->allocBlockSize;
    if ((MutexSys *)(vgeomID.field_0.v[0] * 4) < pMVar8 ||
        (long)(vgeomID.field_0.v[0] * 4) - (long)pMVar8 == 0) {
      local_e8.mutex = pMVar8;
      pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
      (alloc.talloc1)->ptr = pcVar20;
      sVar22 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar22;
      (alloc.talloc1)->end = (size_t)local_e8.mutex;
      (alloc.talloc1)->cur = uVar18;
      if (local_e8.mutex < (ulong)uVar18) {
        (alloc.talloc1)->cur = 0;
        local_e8.mutex = (MutexSys *)(alloc.talloc1)->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
        (alloc.talloc1)->ptr = pcVar20;
        sVar22 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar22;
        (alloc.talloc1)->end = (size_t)local_e8.mutex;
        (alloc.talloc1)->cur = uVar18;
        if (local_e8.mutex < (ulong)uVar18) {
          (alloc.talloc1)->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_00494051;
        }
      }
      (alloc.talloc1)->bytesWasted = sVar22;
    }
    else {
      pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vgeomID);
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar23;
    pcVar20 = (alloc.talloc1)->ptr + (uVar19 - vgeomID.field_0._0_8_);
  }
LAB_00494051:
  for (uVar19 = 0; uVar19 != uVar26; uVar19 = uVar19 + 1) {
    uVar23 = local_80->_end;
    lVar24 = *(long *)(*(long *)local_88 + 0x68);
    vgeomID.field_0.v[0] = -1;
    vgeomID.field_0.i[2] = 0xffffffff;
    vgeomID.field_0.i[3] = 0xffffffff;
    vprimID.field_0.i[0] = 0xffffffff;
    vprimID.field_0.i[1] = 0xffffffff;
    vprimID.field_0.i[2] = 0xffffffff;
    vprimID.field_0.i[3] = 0xffffffff;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8.mutex = (MutexSys *)0x0;
    local_e8.locked = false;
    local_e8._9_7_ = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.mutex = (MutexSys *)0x0;
    local_b8.locked = false;
    local_b8._9_7_ = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = (value_type)0x0;
    uStack_70 = 0;
    pfVar27 = prims[uVar21].upper.field_0.m128 + 3;
    for (uVar28 = 0; (uVar28 < 4 && (uVar21 + uVar28 < uVar23)); uVar28 = uVar28 + 1) {
      fVar4 = *pfVar27;
      lVar5 = *(long *)(*(long *)(lVar24 + 0x1e8) + (ulong)(uint)pfVar27[-4] * 8);
      lVar29 = (ulong)(uint)fVar4 * *(long *)(lVar5 + 0x68);
      lVar6 = *(long *)(lVar5 + 0x58);
      lVar7 = *(long *)(lVar5 + 0x90);
      lVar5 = *(long *)(lVar5 + 0xa0);
      puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + lVar29) * lVar5);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      uVar11 = puVar2[2];
      puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 4 + lVar29) * lVar5);
      uVar12 = *puVar2;
      uVar13 = puVar2[1];
      uVar14 = puVar2[2];
      puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 8 + lVar29) * lVar5);
      uVar15 = *puVar2;
      uVar16 = puVar2[1];
      uVar17 = puVar2[2];
      vgeomID.field_0.i[uVar28] = (uint)pfVar27[-4];
      vprimID.field_0.i[uVar28] = (uint)fVar4;
      *(undefined4 *)((long)&local_e8.mutex + uVar28 * 4) = uVar9;
      *(undefined4 *)((long)&local_d8 + uVar28 * 4) = uVar10;
      *(undefined4 *)((long)&local_c8 + uVar28 * 4) = uVar11;
      *(undefined4 *)((long)&local_b8.mutex + uVar28 * 4) = uVar12;
      *(undefined4 *)((long)&local_a8 + uVar28 * 4) = uVar13;
      *(undefined4 *)((long)&local_98 + uVar28 * 4) = uVar14;
      *(undefined4 *)((long)&local_78 + uVar28 * 4) = uVar15;
      *(undefined4 *)((long)&local_68 + uVar28 * 4) = uVar16;
      *(undefined4 *)((long)&local_58 + uVar28 * 4) = uVar17;
      pfVar27 = pfVar27 + 8;
    }
    lVar24 = uVar19 * 0xb0;
    pcVar3 = pcVar20 + lVar24;
    *(MutexSys **)pcVar3 = local_e8.mutex;
    pcVar3[8] = local_e8.locked;
    pcVar3[9] = local_e8._9_1_;
    pcVar3[10] = local_e8._10_1_;
    pcVar3[0xb] = local_e8._11_1_;
    pcVar3[0xc] = local_e8._12_1_;
    pcVar3[0xd] = local_e8._13_1_;
    pcVar3[0xe] = local_e8._14_1_;
    pcVar3[0xf] = local_e8._15_1_;
    *(undefined8 *)(pcVar20 + lVar24 + 0x10) = local_d8;
    *(undefined8 *)(pcVar20 + lVar24 + 0x10 + 8) = uStack_d0;
    *(undefined8 *)(pcVar20 + lVar24 + 0x20) = local_c8;
    *(undefined8 *)(pcVar20 + lVar24 + 0x20 + 8) = uStack_c0;
    pcVar3 = pcVar20 + lVar24 + 0x30;
    *(MutexSys **)pcVar3 = local_b8.mutex;
    pcVar3[8] = local_b8.locked;
    pcVar3[9] = local_b8._9_1_;
    pcVar3[10] = local_b8._10_1_;
    pcVar3[0xb] = local_b8._11_1_;
    pcVar3[0xc] = local_b8._12_1_;
    pcVar3[0xd] = local_b8._13_1_;
    pcVar3[0xe] = local_b8._14_1_;
    pcVar3[0xf] = local_b8._15_1_;
    *(undefined8 *)(pcVar20 + lVar24 + 0x40) = local_a8;
    *(undefined8 *)(pcVar20 + lVar24 + 0x40 + 8) = uStack_a0;
    *(undefined8 *)(pcVar20 + lVar24 + 0x50) = local_98;
    *(undefined8 *)(pcVar20 + lVar24 + 0x50 + 8) = uStack_90;
    *(value_type *)(pcVar20 + lVar24 + 0x60) = local_78;
    *(undefined8 *)(pcVar20 + lVar24 + 0x60 + 8) = uStack_70;
    *(undefined8 *)(pcVar20 + lVar24 + 0x70) = local_68;
    *(undefined8 *)(pcVar20 + lVar24 + 0x70 + 8) = uStack_60;
    *(undefined8 *)(pcVar20 + lVar24 + 0x80) = local_58;
    *(undefined8 *)(pcVar20 + lVar24 + 0x80 + 8) = uStack_50;
    *(longlong *)(pcVar20 + lVar24 + 0x90) = vgeomID.field_0.v[0];
    *(longlong *)((long)(pcVar20 + lVar24 + 0x90) + 8) =
         CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
    *(ulong *)(pcVar20 + lVar24 + 0xa0) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
    *(ulong *)(pcVar20 + lVar24 + 0xa0 + 8) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
    uVar21 = uVar21 + uVar28;
  }
  uVar21 = 7;
  if (uVar26 < 7) {
    uVar21 = uVar26;
  }
  return (NodeRefPtr<4>)(uVar21 | (ulong)pcVar20 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }